

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O3

void __thiscall
Time::run(Time *this,unsigned_long_long events,StochasticEventGenerator *eventSource,
         unsigned_long_long maxSteps,ostream *log,bool init)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  pointer ppTVar5;
  pointer ppEVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(log,"\rstarting simulation: ",0x16);
  poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)log);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," events from ",0xd);
  pcVar1 = (eventSource->super_StochasticVariable).super_StochasticProcess.super_Parametric.
           parametricName._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,
             pcVar1 + (eventSource->super_StochasticVariable).super_StochasticProcess.
                      super_Parametric.parametricName._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".         \t",0xb);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (init) {
    ppTVar5 = (this->timeObjects).
              super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppTVar5) {
      uVar8 = 0;
      uVar9 = 1;
      do {
        (*ppTVar5[uVar8]->_vptr_TimeDependent[4])();
        ppTVar5 = (this->timeObjects).
                  super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        bVar2 = uVar9 < (ulong)((long)(this->timeObjects).
                                      super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >>
                               3);
        uVar8 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar2);
    }
    ppEVar6 = (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl
        .super__Vector_impl_data._M_finish != ppEVar6) {
      uVar8 = 0;
      uVar9 = 1;
      do {
        (*(ppEVar6[uVar8]->super_Parametric)._vptr_Parametric[4])();
        ppEVar6 = (this->timeEstimators).
                  super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        bVar2 = uVar9 < (ulong)((long)(this->timeEstimators).
                                      super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar6 >> 3
                               );
        uVar8 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar2);
    }
  }
  if (maxSteps != 0 && events != 0) {
    uVar11 = 0;
    uVar9 = 0;
    uVar8 = 0;
    while (bVar2 = step(this), bVar2) {
      iVar10 = (int)((ulong)((long)(this->timeEstimators).
                                   super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->timeEstimators).
                                  super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      while (iVar10 != 0) {
        iVar10 = iVar10 + -1;
        (*((this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar10]->super_Parametric)._vptr_Parametric[5])
                  ();
      }
      iVar10 = (int)((ulong)((long)(this->timeObjects).
                                   super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->timeObjects).
                                  super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      while (iVar10 != 0) {
        iVar10 = iVar10 + -1;
        (*(this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar10]->_vptr_TimeDependent[2])();
      }
      uVar3 = (*(eventSource->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                _vptr_Parametric[0xf])();
      uVar9 = uVar9 + (uVar3 & 0xff);
      uVar7 = (uVar9 * 100) / events;
      if (uVar7 != uVar8) {
        std::__ostream_insert<char,std::char_traits<char>>(log,"\rrunning simulation: ",0x15);
        poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)log);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%         \t",0xb);
        std::ostream::flush();
        uVar8 = uVar7;
      }
      uVar11 = uVar11 + 1;
      if ((char)uVar3 != '\0') {
        uVar11 = 1;
      }
      if (events <= uVar9) {
        return;
      }
      if (maxSteps <= uVar11) {
        return;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (log,"\rerror running simulation: some circular dependencies couldn\'t be resolved",
               0x4a);
    std::ios::widen((char)log->_vptr_basic_ostream[-3] + (char)log);
    std::ostream::put((char)log);
    std::ostream::flush();
  }
  return;
}

Assistant:

void Time::run(unsigned long long events, StochasticEventGenerator *eventSource, unsigned long long maxSteps, ostream &log, bool init)
{
	// starting note
	log << "\rstarting simulation: " 
			<< events << " events from "
			<< eventSource->getName()
			<< ".         \t"
			<< endl;
	
	// initialise time objects
	if (init) {
		for (uint i=0; i<timeObjects.size(); ++i)
			timeObjects[i]->init();
		for (uint i=0; i<timeEstimators.size(); ++i)
			timeEstimators[i]->init();
	}
	
	unsigned long long lastPercentage = 0;
	for (unsigned long long e=0, s=0; e<events && s<maxSteps; ++s) {

		// perform time step, throw error if unsuccessful
		if (!step()) {
			log << "\rerror running simulation: some circular dependencies couldn't be resolved" << endl;
			return;
		}
		
		// collect values in all estimators
		for (int i=timeEstimators.size()-1; i+1; --i)
			timeEstimators[i]->collect();

		// advance all objects in time
		for (int i=timeObjects.size()-1; i+1; --i)
			timeObjects[i]->proceedToNextState();

		// count events
		if (eventSource->hasEvent()) {
			++e;
			s = 0;
		}
		
		// note to user
		unsigned long long currentPercentage = ( e * 100ULL ) / events;
		if (currentPercentage != lastPercentage) {
			log << "\rrunning simulation: " 
					<< currentPercentage
					<< "%         \t"
					<< flush;
			lastPercentage = currentPercentage;
		}
	}
}